

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  stbrp_node *psVar5;
  stbrp_node *psVar6;
  stbrp_context *psVar7;
  uint uVar8;
  uint uVar9;
  int *piVar10;
  stbrp_node **ppsVar11;
  long lVar12;
  int *piVar13;
  stbrp_node *psVar14;
  int iVar15;
  uint uVar16;
  stbrp_node **ppsVar17;
  int iVar18;
  stbrp_rect *psVar19;
  int *piVar20;
  stbrp_context *psVar21;
  stbrp_context *psVar22;
  uint local_8c;
  uint local_88;
  int local_84;
  stbrp_node **local_80;
  int local_50;
  int waste;
  size_t local_48;
  int *local_40;
  stbrp_rect *local_38;
  
  piVar10 = (int *)0x0;
  piVar20 = (int *)0x0;
  if (0 < num_rects) {
    piVar20 = (int *)(ulong)(uint)num_rects;
  }
  piVar13 = &rects->was_packed;
  for (; piVar20 != piVar10; piVar10 = (int *)((long)piVar10 + 1)) {
    *piVar13 = (int)piVar10;
    piVar13 = piVar13 + 4;
  }
  local_48 = (size_t)num_rects;
  qsort(rects,local_48,0x10,rect_height_compare);
  ppsVar1 = &context->active_head;
  piVar10 = (int *)0x0;
  local_40 = piVar20;
  local_38 = rects;
  do {
    if (piVar10 == piVar20) {
      qsort(rects,local_48,0x10,rect_original_order);
      for (lVar12 = 0; (long)piVar20 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        uVar16 = 1;
        if (*(short *)((long)&rects->x + lVar12) == -1) {
          uVar16 = (uint)(*(short *)((long)&rects->y + lVar12) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar12) = uVar16;
      }
      return (int)lVar12;
    }
    uVar2 = rects[(long)piVar10].w;
    if ((uVar2 == 0) || (uVar3 = rects[(long)piVar10].h, uVar3 == 0)) {
      rects[(long)piVar10].x = 0;
      rects[(long)piVar10].y = 0;
    }
    else {
      iVar15 = context->align;
      iVar18 = (uint)uVar2 + iVar15 + -1;
      iVar18 = iVar18 - iVar18 % iVar15;
      if (iVar18 % iVar15 != 0) {
        __assert_fail("width % c->align == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_rectpack.h"
                      ,0x168,
                      "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)");
      }
      iVar15 = context->width;
      psVar19 = rects;
      if ((iVar18 <= iVar15) && ((int)(uint)uVar3 <= context->height)) {
        local_84 = 0x40000000;
        local_8c = 0x40000000;
        local_80 = (stbrp_node **)0x0;
        ppsVar17 = ppsVar1;
        piVar13 = piVar10;
        psVar22 = (stbrp_context *)*ppsVar1;
        while( true ) {
          uVar4 = (ushort)psVar22->width;
          uVar16 = (uint)uVar3;
          if (iVar15 < (int)((uint)uVar4 + iVar18)) break;
          uVar8 = stbrp__skyline_find_min_y
                            (psVar22,(stbrp_node *)(ulong)uVar4,iVar18,(int)&waste,piVar13);
          if (context->heuristic == 0) {
            if ((int)uVar8 < (int)local_8c) {
              local_8c = uVar8;
              local_80 = ppsVar17;
            }
          }
          else if (((int)(uVar16 + uVar8) <= context->height) &&
                  (((int)uVar8 < (int)local_8c || (waste < local_84 && uVar8 == local_8c)))) {
            local_84 = waste;
            local_8c = uVar8;
            local_80 = ppsVar17;
          }
          ppsVar17 = (stbrp_node **)&psVar22->align;
          iVar15 = context->width;
          psVar22 = *(stbrp_context **)&psVar22->align;
        }
        if (local_80 == (stbrp_node **)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = (uint)(*local_80)->x;
        }
        if (context->heuristic == 1) {
          psVar22 = (stbrp_context *)*ppsVar1;
          psVar21 = psVar22;
          while (ppsVar17 = ppsVar1, piVar13 = piVar10, (int)(uint)(ushort)psVar21->width < iVar18)
          {
            psVar21 = *(stbrp_context **)&psVar21->align;
          }
          for (; psVar19 = local_38, piVar20 = local_40, psVar21 != (stbrp_context *)0x0;
              psVar21 = *(stbrp_context **)&psVar21->align) {
            uVar8 = (uint)(ushort)psVar21->width - iVar18;
            psVar7 = psVar22;
            if ((int)uVar8 < 0) {
              __assert_fail("xpos >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_rectpack.h"
                            ,0x1a8,
                            "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                           );
            }
            do {
              psVar22 = psVar7;
              ppsVar11 = ppsVar17;
              ppsVar17 = (stbrp_node **)&psVar22->align;
              psVar7 = *(stbrp_context **)&psVar22->align;
            } while ((ushort)(*(stbrp_context **)&psVar22->align)->width <= uVar8);
            if (uVar8 < (ushort)psVar22->width) {
              __assert_fail("node->next->x > xpos && node->x <= xpos",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imstb_rectpack.h"
                            ,0x1ae,
                            "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                           );
            }
            uVar9 = stbrp__skyline_find_min_y
                              (psVar22,(stbrp_node *)(ulong)uVar8,iVar18,(int)&local_50,piVar13);
            if ((((int)(uVar16 + uVar9) <= context->height) && ((int)uVar9 <= (int)local_8c)) &&
               (((uVar9 < local_8c || (local_50 < local_84)) ||
                ((local_50 == local_84 && ((int)uVar8 < (int)local_88)))))) {
              local_84 = local_50;
              local_8c = uVar9;
              local_88 = uVar8;
              local_80 = ppsVar11;
            }
            ppsVar17 = ppsVar11;
          }
        }
        if (((local_80 != (stbrp_node **)0x0) && ((int)(uVar16 + local_8c) <= context->height)) &&
           (psVar5 = context->free_head, psVar5 != (stbrp_node *)0x0)) {
          psVar5->x = (stbrp_coord)local_88;
          psVar5->y = (stbrp_coord)(uVar16 + local_8c);
          context->free_head = psVar5->next;
          psVar6 = *local_80;
          psVar14 = psVar6;
          if ((int)(uint)psVar6->x < (int)local_88) {
            psVar14 = psVar6->next;
            local_80 = &psVar6->next;
          }
          *local_80 = psVar5;
          iVar15 = local_88 + uVar2;
          while ((psVar6 = psVar14->next, psVar6 != (stbrp_node *)0x0 &&
                 ((int)(uint)psVar6->x <= iVar15))) {
            psVar14->next = context->free_head;
            context->free_head = psVar14;
            psVar14 = psVar6;
          }
          psVar5->next = psVar14;
          if ((int)(uint)psVar14->x < iVar15) {
            psVar14->x = (stbrp_coord)iVar15;
          }
          rects[(long)piVar10].x = (stbrp_coord)local_88;
          rects[(long)piVar10].y = (stbrp_coord)local_8c;
          rects = psVar19;
          goto LAB_0012d277;
        }
      }
      rects[(long)piVar10].x = 0xffff;
      rects[(long)piVar10].y = 0xffff;
      rects = psVar19;
    }
LAB_0012d277:
    piVar10 = (int *)((long)piVar10 + 1);
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}